

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  value_type_conflict *__val;
  size_t sVar5;
  ostream *poVar6;
  pointer pdVar7;
  char *__s;
  string *input_stream;
  double dVar8;
  int num_bin;
  int output_interval;
  vector<double,_std::allocator<double>_> data;
  double upper_bound;
  double lower_bound;
  vector<double,_std::allocator<double>_> histogram;
  vector<double,_std::allocator<double>_> data_1;
  ostringstream error_message_7;
  Buffer buffer;
  ifstream ifs;
  StatisticsAccumulation statistics_accumulation;
  HistogramCalculation histogram_calculation;
  int local_4f0;
  int local_4ec;
  undefined1 local_4e8 [32];
  ulong local_4c8;
  double local_4c0;
  double local_4b8;
  vector<double,_std::allocator<double>_> local_4b0;
  vector<double,_std::allocator<double>_> local_498;
  string local_478 [3];
  ios_base local_408 [264];
  Buffer local_300;
  string local_280;
  byte abStack_260 [80];
  ios_base local_210 [408];
  StatisticsAccumulation local_78;
  HistogramCalculation local_60;
  
  local_4ec = -1;
  local_4f0 = 10;
  local_4b8 = 0.0;
  local_4c0 = 1.0;
  local_4c8 = 0;
LAB_00103785:
  while (iVar4 = ya_getopt_long(argc,argv,"t:b:l:u:nh",(option *)0x0,(int *)0x0), iVar4 < 0x6c) {
    if (iVar4 != 0x62) {
      if (iVar4 != -1) {
        if (iVar4 == 0x68) {
          anon_unknown.dwarf_2dde::PrintUsage((ostream *)&std::cout);
          return 0;
        }
        goto switchD_001037af_caseD_6d;
      }
      if (local_4c0 <= local_4b8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_280,"Upper bound must be greater than lower bound",0x2c);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_280);
        goto LAB_00103bdc;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_280,"Too many input files",0x14);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_280);
        goto LAB_00103bdc;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_280,"Cannot set translation mode",0x1b);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_280);
        goto LAB_00103bdc;
      }
      input_stream = &local_280;
      std::ifstream::ifstream(input_stream);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_280,(_Ios_Openmode)__s),
         (abStack_260[*(long *)(local_280._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          input_stream = (string *)&std::cin;
        }
        sptk::HistogramCalculation::HistogramCalculation(&local_60,local_4f0,local_4b8,local_4c0);
        if (local_60.is_valid_ != false) {
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_4b0,(long)local_4f0,(allocator_type *)local_478);
          if ((long)local_4ec == 0xffffffffffffffff) {
            local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)operator_new(8);
            local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
            *local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start = 0.0;
            local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            sptk::StatisticsAccumulation::StatisticsAccumulation
                      (&local_78,local_4f0 + -1,1,false,false);
            sptk::StatisticsAccumulation::Buffer::Buffer(&local_300);
            goto LAB_00103fec;
          }
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)local_4e8,(long)local_4ec,
                     (allocator_type *)local_478);
          iVar4 = 0;
          goto LAB_00103e02;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_478,"Failed to initialize HistogramCalculation",0x29);
        local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
        sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_478,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_478,__s,sVar5);
        local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
        sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
      }
      if ((vector<double,_std::allocator<double>_> *)local_300._vptr_Buffer !=
          &local_300.first_order_statistics_) {
        operator_delete(local_300._vptr_Buffer);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
      std::ios_base::~ios_base(local_408);
      iVar4 = 1;
      goto LAB_0010424f;
    }
    std::__cxx11::string::string((string *)&local_280,ya_optarg,(allocator *)local_478);
    bVar1 = sptk::ConvertStringToInteger(&local_280,&local_4f0);
    bVar2 = local_4f0 < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_280,"The argument for the -b option must be a positive integer",
                 0x39);
      local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
      sptk::PrintErrorMessage(local_478,(ostringstream *)&local_280);
LAB_00103bdc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478[0]._M_dataplus._M_p != &local_478[0].field_2) {
        operator_delete(local_478[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_280);
      std::ios_base::~ios_base(local_210);
      return 1;
    }
  }
  if (iVar4 - 0x6cU < 10) {
    switch(iVar4) {
    case 0x6c:
      std::__cxx11::string::string((string *)&local_280,ya_optarg,(allocator *)local_478);
      bVar2 = sptk::ConvertStringToDouble(&local_280,&local_4b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_280,"The argument for the -l option must be numeric",0x2e);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_280);
        goto LAB_00103bdc;
      }
      goto LAB_00103785;
    case 0x6e:
      local_4c8 = CONCAT71((int7)((ulong)((long)&switchD_001037af::switchdataD_0010d018 +
                                         (long)(int)(&switchD_001037af::switchdataD_0010d018)
                                                    [iVar4 - 0x6cU]) >> 8),1);
      goto LAB_00103785;
    case 0x74:
      std::__cxx11::string::string((string *)&local_280,ya_optarg,(allocator *)local_478);
      bVar1 = sptk::ConvertStringToInteger(&local_280,&local_4ec);
      bVar2 = local_4ec < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_280,"The argument for the -t option must be a positive integer"
                   ,0x39);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_280);
        goto LAB_00103bdc;
      }
      goto LAB_00103785;
    case 0x75:
      std::__cxx11::string::string((string *)&local_280,ya_optarg,(allocator *)local_478);
      bVar2 = sptk::ConvertStringToDouble(&local_280,&local_4c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_280,"The argument for the -u option must be numeric",0x2e);
        local_478[0]._M_dataplus._M_p = (pointer)&local_478[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"histogram","");
        sptk::PrintErrorMessage(local_478,(ostringstream *)&local_280);
        goto LAB_00103bdc;
      }
      goto LAB_00103785;
    }
  }
switchD_001037af_caseD_6d:
  anon_unknown.dwarf_2dde::PrintUsage((ostream *)&std::cerr);
  return 1;
LAB_00103e02:
  bVar2 = sptk::ReadStream<double>
                    (false,0,0,local_4ec,(vector<double,_std::allocator<double>_> *)local_4e8,
                     (istream *)input_stream,(int *)0x0);
  if (!bVar2) goto LAB_00104098;
  bVar1 = sptk::HistogramCalculation::Run
                    (&local_60,(vector<double,_std::allocator<double>_> *)local_4e8,&local_4b0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to calculate histogram",0x1d);
    local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
    sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
LAB_001041f1:
    if ((vector<double,_std::allocator<double>_> *)local_300._vptr_Buffer !=
        &local_300.first_order_statistics_) {
      operator_delete(local_300._vptr_Buffer);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
    std::ios_base::~ios_base(local_408);
    iVar4 = 1;
    goto LAB_0010422a;
  }
  if ((local_4c8 & 1) != 0) {
    if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar8 = 0.0;
      pdVar7 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar8 = dVar8 + *pdVar7;
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 != local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        pdVar7 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          *pdVar7 = *pdVar7 * (1.0 / dVar8);
          pdVar7 = pdVar7 + 1;
        } while (pdVar7 != local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        goto LAB_00103e9e;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to calculate normalized histogram at ",0x2c);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_478,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"th frame",8);
    local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
    sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
    goto LAB_001041f1;
  }
LAB_00103e9e:
  bVar1 = sptk::WriteStream<double>(0,local_4f0,&local_4b0,(ostream *)&std::cout,(int *)0x0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to write histogram",0x19);
    local_300._vptr_Buffer = (_func_int **)&local_300.first_order_statistics_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"histogram","");
    sptk::PrintErrorMessage((string *)&local_300,(ostringstream *)local_478);
    goto LAB_001041f1;
  }
  iVar4 = iVar4 + 1;
  goto LAB_00103e02;
LAB_00104098:
  iVar4 = 0;
LAB_0010422a:
  if ((pointer)local_4e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_4e8._0_8_);
  }
  if (bVar2) goto LAB_00104240;
  goto LAB_0010423d;
LAB_00103fec:
  bVar2 = sptk::ReadStream<double>(false,0,0,1,&local_498,(istream *)input_stream,(int *)0x0);
  if (bVar2) {
    bVar2 = sptk::HistogramCalculation::Run(&local_60,&local_498,&local_4b0);
    if (bVar2) goto code_r0x00104028;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to calculate histogram",0x1d);
    local_4e8._0_8_ = local_4e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
    sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
    goto LAB_00104479;
  }
  bVar2 = sptk::StatisticsAccumulation::GetSum(&local_78,&local_300,&local_4b0);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_478,"Failed to get histogram",0x17);
    local_4e8._0_8_ = local_4e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
    sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
    goto LAB_00104479;
  }
  if ((local_4c8 & 1) == 0) goto LAB_001042e2;
  if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    dVar8 = 0.0;
    pdVar7 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      dVar8 = dVar8 + *pdVar7;
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      pdVar7 = local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        *pdVar7 = *pdVar7 * (1.0 / dVar8);
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 != local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
LAB_001042e2:
      iVar4 = 0;
      bVar1 = sptk::WriteStream<double>(0,local_4f0,&local_4b0,(ostream *)&std::cout,(int *)0x0);
      bVar2 = true;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_478,"Failed to write histogram",0x19);
        local_4e8._0_8_ = local_4e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
        sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
        goto LAB_00104479;
      }
      goto LAB_001044b1;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_478,"Failed to calculate normalized histogram",0x28);
  local_4e8._0_8_ = local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
  sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
  goto LAB_00104479;
code_r0x00104028:
  bVar2 = sptk::StatisticsAccumulation::Run(&local_78,&local_4b0,&local_300);
  if (!bVar2) goto LAB_0010403a;
  goto LAB_00103fec;
LAB_0010403a:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_478,"Failed to accumulate histogram",0x1e);
  local_4e8._0_8_ = local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"histogram","");
  sptk::PrintErrorMessage((string *)local_4e8,(ostringstream *)local_478);
LAB_00104479:
  if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
    operator_delete((void *)local_4e8._0_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
  std::ios_base::~ios_base(local_408);
  iVar4 = 1;
  bVar2 = false;
LAB_001044b1:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&local_300);
  if (local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (!bVar2) goto LAB_00104240;
LAB_0010423d:
  iVar4 = 0;
LAB_00104240:
  if (local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_4b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_0010424f:
  std::ifstream::~ifstream(&local_280);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int output_interval(kMagicNumberForEndOfFile);
  int num_bin(kDefaultNumBin);
  double lower_bound(kDefaultLowerBound);
  double upper_bound(kDefaultUpperBound);
  bool normalization_flag(kDefaultNormalizationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "t:b:l:u:nh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'b': {
        if (!sptk::ConvertStringToInteger(optarg, &num_bin) || num_bin <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -b option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        normalization_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (upper_bound <= lower_bound) {
    std::ostringstream error_message;
    error_message << "Upper bound must be greater than lower bound";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::HistogramCalculation histogram_calculation(num_bin, lower_bound,
                                                   upper_bound);
  if (!histogram_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize HistogramCalculation";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::vector<double> histogram(num_bin);

  if (kMagicNumberForEndOfFile == output_interval) {
    std::vector<double> data(1);
    sptk::StatisticsAccumulation statistics_accumulation(num_bin - 1, 1);
    sptk::StatisticsAccumulation::Buffer buffer;
    while (sptk::ReadStream(false, 0, 0, 1, &data, &input_stream, NULL)) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      if (!statistics_accumulation.Run(histogram, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }

    if (!statistics_accumulation.GetSum(buffer, &histogram)) {
      std::ostringstream error_message;
      error_message << "Failed to get histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }

    if (normalization_flag) {
      const double sum(
          std::accumulate(histogram.begin(), histogram.end(), 0.0));
      if (0.0 == sum) {
        std::ostringstream error_message;
        error_message << "Failed to calculate normalized histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      const double z(1.0 / sum);
      std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                     [z](double x) { return x * z; });
    }

    if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  } else {
    std::vector<double> data(output_interval);
    for (int frame_index(0); sptk::ReadStream(false, 0, 0, output_interval,
                                              &data, &input_stream, NULL);
         ++frame_index) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }

      if (normalization_flag) {
        const double sum(
            std::accumulate(histogram.begin(), histogram.end(), 0.0));
        if (0.0 == sum) {
          std::ostringstream error_message;
          error_message << "Failed to calculate normalized histogram at "
                        << frame_index << "th frame";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        const double z(1.0 / sum);
        std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                       [z](double x) { return x * z; });
      }

      if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }
  }

  return 0;
}